

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfHiResTimer.c
# Opt level: O3

sbfHiResTimer sbfHiResTimer_create(sbfQueue queue,sbfHiResTimerCb cb,void *closure,u_int interval)

{
  ulong uVar1;
  sbfHiResTimerImpl *elm;
  uint64_t uVar2;
  
  elm = (sbfHiResTimerImpl *)sbfMemory_malloc(0x60);
  elm->mQueue = queue;
  elm->mInterval = interval;
  uVar2 = sbfPerfCounter_ticks((double)interval);
  elm->mTicks = uVar2;
  uVar1 = rdtsc();
  elm->mNext = (uVar1 & 0xffffffff) + elm->mTicks + (uVar1 & 0xffffffff00000000);
  elm->mCb = cb;
  elm->mClosure = closure;
  elm->mDestroyed = 0;
  (elm->mRefCount).mRefCount = 1;
  sbfLog_log(elm->mQueue->mLog,0,"creating hi-res timer %p: interval %u microseconds",elm,
             elm->mInterval);
  sbfHiResTimerTreeImpl_RB_INSERT(&queue->mHiResTimers,elm);
  return elm;
}

Assistant:

sbfHiResTimer
sbfHiResTimer_create (sbfQueue queue,
                      sbfHiResTimerCb cb,
                      void* closure,
                      u_int interval)
{
    sbfHiResTimer timer;

    timer = xmalloc (sizeof *timer);
    timer->mQueue = queue;

    timer->mInterval = interval;

    timer->mTicks = sbfPerfCounter_ticks (timer->mInterval);
    timer->mNext = sbfPerfCounter_get () + timer->mTicks;

    timer->mCb = cb;
    timer->mClosure = closure;

    timer->mDestroyed = 0;
    sbfRefCount_init (&timer->mRefCount, 1);

    sbfLog_debug (timer->mQueue->mLog,
                  "creating hi-res timer %p: interval %u microseconds",
                  timer,
                  timer->mInterval);

    RB_INSERT (sbfHiResTimerTreeImpl, &queue->mHiResTimers, timer);

    return timer;
}